

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_bpf_init(ma_bpf_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                     ma_bpf *pBPF)

{
  ma_result mVar1;
  void *pHeap;
  ma_bpf_heap_layout heapLayout;
  ma_bpf_heap_layout local_38;
  
  mVar1 = ma_bpf_get_heap_layout(pConfig,&local_38);
  if (mVar1 != MA_SUCCESS) {
    return mVar1;
  }
  if (local_38.sizeInBytes == 0) {
    pHeap = (void *)0x0;
LAB_0013bb53:
    if (pBPF == (ma_bpf *)0x0) {
      mVar1 = MA_INVALID_ARGS;
    }
    else {
      pBPF->pBPF2 = (ma_bpf2 *)0x0;
      pBPF->_pHeap = (void *)0x0;
      pBPF->format = ma_format_unknown;
      pBPF->channels = 0;
      *(undefined8 *)&pBPF->bpf2Count = 0;
      *(undefined8 *)&pBPF->_ownsHeap = 0;
      mVar1 = ma_bpf_reinit__internal(pConfig,pHeap,pBPF,1);
      if (mVar1 == MA_SUCCESS) {
        pBPF->_ownsHeap = 1;
        return MA_SUCCESS;
      }
    }
    ma_free(pHeap,pAllocationCallbacks);
  }
  else {
    if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
      pHeap = malloc(local_38.sizeInBytes);
LAB_0013bb4b:
      if (pHeap != (void *)0x0) goto LAB_0013bb53;
    }
    else if (pAllocationCallbacks->onMalloc != (_func_void_ptr_size_t_void_ptr *)0x0) {
      pHeap = (*pAllocationCallbacks->onMalloc)
                        (local_38.sizeInBytes,pAllocationCallbacks->pUserData);
      goto LAB_0013bb4b;
    }
    mVar1 = MA_OUT_OF_MEMORY;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_bpf_init(const ma_bpf_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_bpf* pBPF)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_bpf_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_bpf_init_preallocated(pConfig, pHeap, pBPF);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pBPF->_ownsHeap = MA_TRUE;
    return MA_SUCCESS;
}